

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  Mutex *this_00;
  Tables *this_01;
  second_type pEVar1;
  DescriptorPool *pDVar2;
  string *psVar3;
  EnumValueOptions *pEVar4;
  EnumValuesByNumberMap *collection;
  WriterMutexLock l_1;
  EnumValueDescriptor *result;
  string enum_value_name;
  ReaderMutexLock l;
  MutexLock local_a0;
  EnumValueDescriptor *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)parent;
  local_90._M_string_length._0_4_ = number;
  pEVar1 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                     (&this->enum_values_by_number_,(first_type *)&local_90);
  if (pEVar1 == (second_type)0x0) {
    this_00 = &this->unknown_enum_values_mu_;
    local_70._M_dataplus._M_p = (pointer)this_00;
    internal::Mutex::Lock(this_00);
    collection = &this->unknown_enum_values_by_number_;
    local_90._M_dataplus._M_p = (pointer)parent;
    local_90._M_string_length._0_4_ = number;
    pEVar1 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       (collection,(first_type *)&local_90);
    internal::MutexLock::~MutexLock((MutexLock *)&local_70);
    if (pEVar1 == (second_type)0x0) {
      local_a0.mu_ = this_00;
      internal::Mutex::Lock(this_00);
      local_90._M_dataplus._M_p = (pointer)parent;
      local_90._M_string_length._0_4_ = number;
      pEVar1 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         (collection,(first_type *)&local_90);
      if (pEVar1 == (second_type)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_90,"UNKNOWN_ENUM_VALUE_%s_%d",**(undefined8 **)parent,(ulong)(uint)number)
        ;
        pDVar2 = DescriptorPool::generated_pool();
        this_01 = (pDVar2->tables_).ptr_;
        pEVar1 = DescriptorPool::Tables::Allocate<google::protobuf::EnumValueDescriptor>(this_01);
        local_98 = pEVar1;
        psVar3 = DescriptorPool::Tables::AllocateString(this_01,&local_90);
        *(string **)pEVar1 = psVar3;
        std::operator+(&local_50,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (parent + 8),".");
        std::operator+(&local_70,&local_50,&local_90);
        psVar3 = DescriptorPool::Tables::AllocateString(this_01,&local_70);
        *(string **)(pEVar1 + 8) = psVar3;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        *(int *)(pEVar1 + 0x10) = number;
        *(EnumDescriptor **)(pEVar1 + 0x18) = parent;
        pEVar4 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(pEVar1 + 0x20) = pEVar4;
        local_70._M_dataplus._M_p = (pointer)parent;
        local_70._M_string_length._0_4_ = number;
        InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (collection,(first_type *)&local_70,&local_98);
        std::__cxx11::string::~string((string *)&local_90);
      }
      internal::MutexLock::~MutexLock(&local_a0);
    }
  }
  return pEVar1;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc =
        FindPtrOrNull(enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != NULL) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    string enum_value_name = StringPrintf(
        "UNKNOWN_ENUM_VALUE_%s_%d", parent->name().c_str(), number);
    DescriptorPool::Tables* tables =
        const_cast<DescriptorPool::Tables*>(DescriptorPool::generated_pool()->
                                            tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ = tables->AllocateString(parent->full_name() +
                                                "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                       std::make_pair(parent, number), result);
    return result;
  }
}